

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw_gl3.cpp
# Opt level: O2

void ImGui_ImplGlfwGL3_Shutdown(void)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x38; lVar1 = lVar1 + 8) {
    glfwDestroyCursor(*(GLFWcursor **)((long)g_MouseCursors + lVar1));
  }
  g_MouseCursors[4] = (GLFWcursor *)0x0;
  g_MouseCursors[5] = (GLFWcursor *)0x0;
  g_MouseCursors[2] = (GLFWcursor *)0x0;
  g_MouseCursors[3] = (GLFWcursor *)0x0;
  g_MouseCursors[0] = (GLFWcursor *)0x0;
  g_MouseCursors[1] = (GLFWcursor *)0x0;
  g_MouseCursors[6] = (GLFWcursor *)0x0;
  ImGui_ImplGlfwGL3_InvalidateDeviceObjects();
  return;
}

Assistant:

void ImGui_ImplGlfwGL3_Shutdown()
{
    // Destroy GLFW mouse cursors
    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        glfwDestroyCursor(g_MouseCursors[cursor_n]);
    memset(g_MouseCursors, 0, sizeof(g_MouseCursors));

    // Destroy OpenGL objects
    ImGui_ImplGlfwGL3_InvalidateDeviceObjects();
}